

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O1

bool parse_options(int argc,char **argv,Options *options)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char cVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  Options *pOVar8;
  int iVar9;
  string line;
  ifstream f;
  value_type local_260;
  Options *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [16];
  
  bVar6 = argc < 2;
  if (1 < argc) {
    this = &options->parse_files;
    local_240 = (Options *)&options->print;
    iVar9 = 1;
    do {
      pcVar5 = argv[iVar9];
      if (*pcVar5 == '-') {
        if ((options->command)._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)options,0,(char *)0x0,0x111196);
        }
        pcVar5 = argv[iVar9];
        iVar2 = strcmp(pcVar5,"-h");
        if (iVar2 == 0) {
          printf("%s [-h] [directory | files.cpp]",*argv);
          return bVar6;
        }
        iVar2 = strcmp(pcVar5,"-filelist");
        if (iVar2 == 0) {
          iVar9 = iVar9 + 1;
          if (iVar9 < argc) {
            std::ifstream::ifstream(local_238,argv[iVar9],_S_in);
            local_260._M_string_length = 0;
            local_260.field_2._M_local_buf[0] = '\0';
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            while( true ) {
              cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                                      (char)local_238);
              piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_238,(string *)&local_260,cVar1);
              if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this,&local_260);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,
                              CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                       local_260.field_2._M_local_buf[0]) + 1);
            }
            std::ifstream::~ifstream(local_238);
          }
        }
        else {
          iVar2 = strcmp(pcVar5,"-print");
          if (iVar2 == 0) {
            iVar9 = iVar9 + 1;
            if (iVar9 < argc) {
              pcVar5 = argv[iVar9];
              pcVar7 = (char *)(options->print)._M_string_length;
              strlen(pcVar5);
              pOVar8 = local_240;
              goto LAB_0010447e;
            }
          }
          else {
            iVar2 = strcmp(pcVar5,"-showtime");
            if (iVar2 == 0) {
              options->show_time = true;
            }
            else {
              iVar2 = strcmp(pcVar5,"-showtokens");
              if (iVar2 == 0) {
                options->show_tokens = true;
              }
              else {
                iVar2 = strcmp(pcVar5,"-showast");
                if (iVar2 == 0) {
                  options->show_ast = true;
                }
                else {
                  iVar2 = strcmp(pcVar5,"-showincludes");
                  if (iVar2 == 0) {
                    options->show_includes = true;
                  }
                  else {
                    iVar2 = strcmp(pcVar5,"-showfunctions");
                    if (iVar2 == 0) {
                      options->show_functions = true;
                    }
                    else {
                      iVar2 = strcmp(pcVar5,"-counttokens");
                      if (iVar2 == 0) {
                        options->count_tokens = true;
                      }
                      else {
                        iVar2 = strcmp(pcVar5,"-countlines");
                        if (iVar2 == 0) {
                          options->count_lines = true;
                        }
                        else {
                          iVar2 = strcmp(pcVar5,"-keywordstats");
                          if (iVar2 == 0) {
                            options->keyword_stats = true;
                          }
                          else {
                            iVar2 = strcmp(pcVar5,"-threads");
                            if (iVar2 == 0) {
                              iVar9 = iVar9 + 1;
                              if (iVar9 < argc) {
                                lVar4 = strtol(argv[iVar9],(char **)0x0,10);
                                options->threads = (int)lVar4;
                              }
                            }
                            else {
                              iVar2 = strcmp(pcVar5,"--");
                              if (iVar2 != 0) {
                                printf("%s: invalid argument %s\n",*argv,pcVar5);
                                return bVar6;
                              }
                              local_238[0]._M_string_length = 0;
                              local_238[0].field_2._M_local_buf[0] = '\0';
                              local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<std::__cxx11::string>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)this,local_238);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
                                operator_delete(local_238[0]._M_dataplus._M_p,
                                                CONCAT71(local_238[0].field_2._M_allocated_capacity.
                                                         _1_7_,local_238[0].field_2._M_local_buf[0])
                                                + 1);
                              }
                              iVar9 = iVar9 + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if ((options->command)._M_string_length == 0) {
        strlen(pcVar5);
        pcVar7 = (char *)0x0;
        pOVar8 = options;
LAB_0010447e:
        std::__cxx11::string::_M_replace((ulong)pOVar8,0,pcVar7,(ulong)pcVar5);
      }
      else {
        std::__cxx11::string::string((string *)local_238,pcVar5,(allocator *)&local_260);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          CONCAT71(local_238[0].field_2._M_allocated_capacity._1_7_,
                                   local_238[0].field_2._M_local_buf[0]) + 1);
        }
      }
      iVar9 = iVar9 + 1;
      bVar6 = argc <= iVar9;
    } while (iVar9 < argc);
  }
  return bVar6;
}

Assistant:

bool parse_options(int argc, char* argv[], Options& options)
{
  for (int i=1; i<argc; ++i) {
    // Ignore empty args?
    if (argv[i][0] != '-') {
      if (options.command.empty())
        options.command = argv[i];
      else
        options.parse_files.push_back(argv[i]);
      continue;
    }
    else if (options.command.empty()) {
      options.command = "none";
    }

    if (std::strcmp(argv[i], "-h") == 0) {
      std::printf("%s [-h] [directory | files.cpp]",
                  argv[0]);
      return false;
    }
    else if (std::strcmp(argv[i], "-filelist") == 0) {
      ++i;
      if (i < argc) {
        std::ifstream f(argv[i]);
        std::string line;
        while (std::getline(f, line)) {
          options.parse_files.push_back(line);
        }
      }
    }
    else if (std::strcmp(argv[i], "-print") == 0) {
      ++i;
      if (i < argc) {
        options.print = argv[i];
      }
    }
    else if (std::strcmp(argv[i], "-showtime") == 0) {
      options.show_time = true;
    }
    else if (std::strcmp(argv[i], "-showtokens") == 0) {
      options.show_tokens = true;
    }
    else if (std::strcmp(argv[i], "-showast") == 0) {
      options.show_ast = true;
    }
    else if (std::strcmp(argv[i], "-showincludes") == 0) {
      options.show_includes = true;
    }
    else if (std::strcmp(argv[i], "-showfunctions") == 0) {
      options.show_functions = true;
    }
    else if (std::strcmp(argv[i], "-counttokens") == 0) {
      options.count_tokens = true;
    }
    else if (std::strcmp(argv[i], "-countlines") == 0) {
      options.count_lines = true;
    }
    else if (std::strcmp(argv[i], "-keywordstats") == 0) {
      options.keyword_stats = true;
    }
    else if (std::strcmp(argv[i], "-threads") == 0) {
      ++i;
      if (i < argc) {
        options.threads = std::strtol(argv[i], nullptr, 10);
      }
    }
    else if (std::strcmp(argv[i], "--") == 0) {
      ++i;
      options.parse_files.push_back(std::string()); // parse stdin
    }
    else {
      std::printf("%s: invalid argument %s\n", argv[0], argv[i]);
      return false;
    }
  }
  return true;
}